

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

RPCHelpMan * scantxoutset(void)

{
  long lVar1;
  size_type *psVar2;
  ulong *puVar3;
  long *plVar4;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string cond;
  string name;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string m_key_name_15;
  string description_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_16;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  RPCExamples examples;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  RPCHelpMan *in_RDI;
  undefined8 uVar9;
  long lVar10;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  undefined8 in_stack_ffffffffffffe868;
  undefined1 in_stack_ffffffffffffe870 [16];
  undefined8 in_stack_ffffffffffffe888;
  undefined8 in_stack_ffffffffffffe890;
  undefined8 in_stack_ffffffffffffe898;
  code *pcVar11;
  undefined8 in_stack_ffffffffffffe8a0;
  undefined1 in_stack_ffffffffffffe8a8 [16];
  pointer in_stack_ffffffffffffe8b8;
  pointer pRVar12;
  pointer pRVar13;
  pointer pRVar14;
  pointer in_stack_ffffffffffffe8d0;
  pointer pRVar15;
  pointer pRVar16;
  pointer pRVar17;
  undefined8 in_stack_ffffffffffffe8f0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1708;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1688;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1668;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1648;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1628;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1608;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15f0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15d8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1598;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1578;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1558;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1540;
  allocator_type local_1521;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1520;
  string local_1508;
  string local_14e8;
  string local_14c8;
  string local_14a8;
  string local_1488;
  string local_1468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1448;
  string local_1428;
  string local_1408;
  string local_13e8;
  string local_13c8;
  string local_13a8;
  string local_1388;
  string local_1368;
  string local_1348;
  string local_1328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1308;
  string local_12e8;
  string local_12c8;
  string local_12a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1228;
  ulong *local_1208;
  undefined8 local_1200;
  ulong local_11f8;
  undefined8 uStack_11f0;
  ulong *local_11e8;
  size_type local_11e0;
  ulong local_11d8;
  undefined8 uStack_11d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  long *local_11a8 [2];
  long local_1198 [2];
  long *local_1188 [2];
  long local_1178 [2];
  long *local_1168 [2];
  long local_1158 [2];
  long *local_1148 [2];
  long local_1138 [2];
  long *local_1128 [2];
  long local_1118 [2];
  long *local_1108 [2];
  long local_10f8 [2];
  long *local_10e8 [2];
  long local_10d8 [2];
  long *local_10c8 [2];
  long local_10b8 [2];
  long *local_10a8 [2];
  long local_1098 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1088;
  size_type *local_1068;
  size_type local_1060;
  size_type local_1058;
  undefined8 uStack_1050;
  long *local_1048 [2];
  long local_1038 [2];
  long *local_1028 [2];
  long local_1018 [2];
  long *local_1008 [2];
  long local_ff8 [2];
  long *local_fe8 [2];
  long local_fd8 [2];
  long *local_fc8 [2];
  long local_fb8 [2];
  long *local_fa8 [2];
  long local_f98 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_f88;
  long *local_f68 [2];
  long local_f58 [2];
  pointer local_f48 [2];
  undefined1 local_f38 [152];
  RPCResult local_ea0;
  RPCResult local_e18;
  RPCResult local_d90;
  RPCResult local_d08;
  RPCResult local_c80;
  RPCResult local_bf8;
  RPCResult local_b70;
  RPCResult local_ae8;
  long *local_a60 [2];
  long local_a50 [2];
  long *local_a40 [2];
  long local_a30 [2];
  RPCResult local_a20;
  long *local_998 [2];
  long local_988 [2];
  long *local_978 [2];
  long local_968 [2];
  long *local_958 [2];
  long local_948 [2];
  long *local_938 [2];
  long local_928 [2];
  long *local_918 [2];
  long local_908 [2];
  long *local_8f8 [2];
  long local_8e8 [2];
  long *local_8d8 [2];
  long local_8c8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_8b8;
  long *local_898 [2];
  long local_888 [2];
  pointer local_878 [2];
  undefined1 local_868 [152];
  RPCResult local_7d0;
  RPCResult local_748;
  RPCResult local_6c0;
  RPCResult local_638;
  RPCResult local_5b0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_528;
  long *local_508 [2];
  long local_4f8 [2];
  long *local_4e8 [2];
  long local_4d8 [2];
  RPCResult local_4c8;
  RPCResult local_440;
  undefined1 local_3b8 [136];
  undefined1 local_330 [136];
  RPCArg local_2a8;
  RPCArg local_1a0;
  long *local_98 [2];
  long local_88 [2];
  _Any_data local_78;
  _Manager_type local_68 [2];
  string EXAMPLE_DESCRIPTOR_RAW;
  
  local_1038[1] = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  EXAMPLE_DESCRIPTOR_RAW._M_dataplus._M_p = (pointer)&EXAMPLE_DESCRIPTOR_RAW.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&EXAMPLE_DESCRIPTOR_RAW,
             "raw(76a91411b366edfc0a8b66feebae5c2e25a7b6a5d1cf3188ac)#fm24fxxy","");
  local_78._M_unused._M_object = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"scantxoutset","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "\nScans the unspent transaction output set for entries that match certain output descriptors.\nExamples of output descriptors are:\n    addr(<address>)                      Outputs whose output script corresponds to the specified address (does not include P2PK)\n    raw(<hex script>)                    Outputs whose output script equals the specified hex-encoded bytes\n    combo(<pubkey>)                      P2PK, P2PKH, P2WPKH, and P2SH-P2WPKH outputs for the given pubkey\n    pkh(<pubkey>)                        P2PKH outputs for the given pubkey\n    sh(multi(<n>,<pubkey>,<pubkey>,...)) P2SH-multisig outputs for the given threshold and pubkeys\n    tr(<pubkey>)                         P2TR\n    tr(<pubkey>,{pk(<pubkey>)})          P2TR with single fallback pubkey in tapscript\n    rawtr(<pubkey>)                      P2TR with the specified key as output key rather than inner\n    wsh(and_v(v:pk(<pubkey>),after(2)))  P2WSH miniscript with mandatory pubkey and a timelock\n\nIn the above, <pubkey> either refers to a fixed public key in hexadecimal notation, or to an xpub/xprv optionally followed by one\nor more path elements separated by \"/\", and optionally ending in \"/*\" (unhardened), or \"/*\'\" or \"/*h\" (hardened) to specify all\nunhardened or hardened child keys.\nIn the latter case, a range needs to be specified by below if different from 1000.\nFor more information on output descriptors, see the documentation in the doc/descriptors.md file.\n"
             ,"");
  RPCArg::RPCArg(&local_2a8,&scan_action_arg_desc);
  RPCArg::RPCArg(&local_1a0,&scan_objects_arg_desc);
  __l._M_len = 2;
  __l._M_array = &local_2a8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1520,__l,&local_1521);
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e8,"when action==\'start\'; only returns after scan completes","");
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"");
  local_528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"");
  local_878[0] = (pointer)local_868;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_878,"success","");
  local_898[0] = local_888;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_898,"Whether the scan was completed","");
  local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1578.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._8_16_ = in_stack_ffffffffffffe870;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name.field_2._8_8_ = in_RDI;
  description._M_string_length = in_stack_ffffffffffffe890;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_868 + 0x10),BOOL,m_key_name,description,inner,SUB81(local_878,0));
  local_8b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_8b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"txouts","");
  local_8d8[0] = local_8c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8d8,"The number of unspent transaction outputs scanned","");
  local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1598.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_00.field_2._8_8_ = in_RDI;
  description_00._M_string_length = in_stack_ffffffffffffe890;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_7d0,NUM,m_key_name_00,description_00,inner_00,SUB81(&local_8b8,0));
  local_8f8[0] = local_8e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f8,"height","");
  local_918[0] = local_908;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_918,"The block height at which the scan was done","");
  local_15b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_01.field_2._8_8_ = in_RDI;
  description_01._M_string_length = in_stack_ffffffffffffe890;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_748,NUM,m_key_name_01,description_01,inner_01,SUB81(local_8f8,0));
  local_938[0] = local_928;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_938,"bestblock","");
  local_958[0] = local_948;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_958,"The hash of the block at the tip of the chain","");
  local_15d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_02.field_2._8_8_ = in_RDI;
  description_02._M_string_length = in_stack_ffffffffffffe890;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_6c0,STR_HEX,m_key_name_02,description_02,inner_02,SUB81(local_938,0));
  local_978[0] = local_968;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_978,"unspents","");
  local_998[0] = local_988;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_998,"");
  local_a40[0] = local_a30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a40,"");
  local_a60[0] = local_a50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a60,"");
  local_f48[0] = (pointer)local_f38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f48,"txid","");
  local_f68[0] = local_f58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f68,"The transaction id","");
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1628.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_03.field_2._8_8_ = in_RDI;
  description_03._M_string_length = in_stack_ffffffffffffe890;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_f38 + 0x10),STR_HEX,m_key_name_03,description_03,inner_03,
             SUB81(local_f48,0));
  local_f88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_f88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f88,"vout","");
  local_fa8[0] = local_f98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fa8,"The vout value","");
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_04.field_2._8_8_ = in_RDI;
  description_04._M_string_length = in_stack_ffffffffffffe890;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_ea0,NUM,m_key_name_04,description_04,inner_04,SUB81(&local_f88,0));
  local_fc8[0] = local_fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fc8,"scriptPubKey","");
  local_fe8[0] = local_fd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fe8,"The output script","");
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_05.field_2._8_8_ = in_RDI;
  description_05._M_string_length = in_stack_ffffffffffffe890;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_e18,STR_HEX,m_key_name_05,description_05,inner_05,SUB81(local_fc8,0));
  local_1008[0] = local_ff8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1008,"desc","");
  local_1028[0] = local_1018;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1028,"A specialized descriptor for the matched output script","");
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_06.field_2._8_8_ = in_RDI;
  description_06._M_string_length = in_stack_ffffffffffffe890;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_d90,STR,m_key_name_06,description_06,inner_06,SUB81(local_1008,0));
  local_1048[0] = local_1038;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1048,"amount","");
  std::operator+(&local_1088,"The total amount in ",&CURRENCY_UNIT_abi_cxx11_);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1088," of the unspent output");
  local_1068 = &local_1058;
  psVar2 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2 == paVar8) {
    local_1058 = paVar8->_M_allocated_capacity;
    uStack_1050 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_1058 = paVar8->_M_allocated_capacity;
    local_1068 = psVar2;
  }
  local_1060 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_16a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_16a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  m_key_name_07._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_07.field_2._8_8_ = in_RDI;
  description_07._M_string_length = in_stack_ffffffffffffe890;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult
            (&local_d08,STR_AMOUNT,m_key_name_07,description_07,inner_07,SUB81(local_1048,0));
  local_10a8[0] = local_1098;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10a8,"coinbase","");
  local_10c8[0] = local_10b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10c8,"Whether this is a coinbase output","");
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_08.field_2._8_8_ = in_RDI;
  description_08._M_string_length = in_stack_ffffffffffffe890;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_c80,BOOL,m_key_name_08,description_08,inner_08,SUB81(local_10a8,0));
  local_10e8[0] = local_10d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10e8,"height","");
  local_1108[0] = local_10f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1108,"Height of the unspent transaction output","");
  local_16e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_09.field_2._8_8_ = in_RDI;
  description_09._M_string_length = in_stack_ffffffffffffe890;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_bf8,NUM,m_key_name_09,description_09,inner_09,SUB81(local_10e8,0));
  local_1128[0] = local_1118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"blockhash","");
  local_1148[0] = local_1138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1148,"Blockhash of the unspent transaction output","");
  local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_10._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_10.field_2._8_8_ = in_RDI;
  description_10._M_string_length = in_stack_ffffffffffffe890;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_b70,STR_HEX,m_key_name_10,description_10,inner_10,SUB81(local_1128,0))
  ;
  local_1168[0] = local_1158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1168,"confirmations","");
  local_1188[0] = local_1178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1188,
             "Number of confirmations of the unspent transaction output when the scan was done","");
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  m_key_name_11._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_11.field_2._8_8_ = in_RDI;
  description_11._M_string_length = in_stack_ffffffffffffe890;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_ae8,NUM,m_key_name_11,description_11,inner_11,SUB81(local_1168,0));
  __l_00._M_len = 9;
  __l_00._M_array = (iterator)(local_f38 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1608,__l_00,(allocator_type *)&stack0xffffffffffffe8d7);
  m_key_name_12._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_12.field_2._8_8_ = in_RDI;
  description_12._M_string_length = in_stack_ffffffffffffe890;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_a20,OBJ,m_key_name_12,description_12,inner_12,SUB81(local_a40,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_a20;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_15f0,__l_01,(allocator_type *)&stack0xffffffffffffe8d6);
  m_key_name_13._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_13.field_2._8_8_ = in_RDI;
  description_13._M_string_length = in_stack_ffffffffffffe890;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe8b8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult(&local_638,ARR,m_key_name_13,description_13,inner_13,SUB81(local_978,0));
  local_11a8[0] = local_1198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11a8,"total_amount","");
  std::operator+(&local_11c8,"The total amount of all found unspent outputs in ",
                 &CURRENCY_UNIT_abi_cxx11_);
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name_14._8_16_ = in_stack_ffffffffffffe870;
  m_key_name_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_14.field_2._8_8_ = in_RDI;
  description_14._M_string_length = in_stack_ffffffffffffe890;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  description_14.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  description_14.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  RPCResult::RPCResult
            (&local_5b0,STR_AMOUNT,m_key_name_14,description_14,inner_14,SUB81(local_11a8,0));
  __l_02._M_len = 6;
  __l_02._M_array = (iterator)(local_868 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1558,__l_02,(allocator_type *)&stack0xffffffffffffe8b7);
  cond._8_16_ = in_stack_ffffffffffffe870;
  cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  cond.field_2._8_8_ = in_RDI;
  m_key_name_15._M_string_length = in_stack_ffffffffffffe890;
  m_key_name_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888;
  m_key_name_15.field_2._M_allocated_capacity = in_stack_ffffffffffffe898;
  m_key_name_15.field_2._8_8_ = in_stack_ffffffffffffe8a0;
  description_16.field_2._M_allocated_capacity = (size_type)pRVar12;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  description_16._M_string_length = in_stack_ffffffffffffe8a8._8_8_;
  description_16.field_2._8_8_ = pRVar13;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8d0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar14;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar15;
  RPCResult::RPCResult(&local_4c8,cond,(Type)local_4e8,m_key_name_15,description_16,inner_15);
  RPCResult::RPCResult(&local_440,&scan_result_abort);
  RPCResult::RPCResult((RPCResult *)local_3b8,&scan_result_status_some);
  RPCResult::RPCResult((RPCResult *)local_330,&scan_result_status_none);
  __l_03._M_len = 4;
  __l_03._M_array = &local_4c8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1540,__l_03,(allocator_type *)&local_1228);
  local_12c8._M_dataplus._M_p = (pointer)&local_12c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12c8,"scantxoutset","");
  std::operator+(&local_1308,"start \'[\"",&EXAMPLE_DESCRIPTOR_RAW);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1308,"\"]\'");
  local_12e8._M_dataplus._M_p = (pointer)&local_12e8.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if (paVar8 == paVar7) {
    local_12e8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_12e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_12e8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_12e8._M_dataplus._M_p = (pointer)paVar8;
  }
  local_12e8._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  HelpExampleCli(&local_12a8,&local_12c8,&local_12e8);
  local_1348._M_dataplus._M_p = (pointer)&local_1348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1348,"scantxoutset","");
  local_1368._M_dataplus._M_p = (pointer)&local_1368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1368,"status","");
  HelpExampleCli(&local_1328,&local_1348,&local_1368);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12a8._M_dataplus._M_p != &local_12a8.field_2) {
    uVar9 = local_12a8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_1328._M_string_length + local_12a8._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1328._M_dataplus._M_p != &local_1328.field_2) {
      uVar9 = local_1328.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_1328._M_string_length + local_12a8._M_string_length) goto LAB_002bc4a7;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1328,0,0,local_12a8._M_dataplus._M_p,local_12a8._M_string_length);
  }
  else {
LAB_002bc4a7:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_12a8,local_1328._M_dataplus._M_p,local_1328._M_string_length);
  }
  local_1288._M_dataplus._M_p = (pointer)&local_1288.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if (paVar7 == paVar8) {
    local_1288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1288.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_1288.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
  }
  else {
    local_1288.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1288._M_dataplus._M_p = (pointer)paVar7;
  }
  local_1288._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  local_13a8._M_dataplus._M_p = (pointer)&local_13a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13a8,"scantxoutset","");
  local_13c8._M_dataplus._M_p = (pointer)&local_13c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13c8,"abort","");
  HelpExampleCli(&local_1388,&local_13a8,&local_13c8);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1288._M_dataplus._M_p != &local_1288.field_2) {
    uVar9 = local_1288.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_1388._M_string_length + local_1288._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1388._M_dataplus._M_p != &local_1388.field_2) {
      uVar9 = local_1388.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_1388._M_string_length + local_1288._M_string_length) goto LAB_002bc5df;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1388,0,0,local_1288._M_dataplus._M_p,local_1288._M_string_length);
  }
  else {
LAB_002bc5df:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1288,local_1388._M_dataplus._M_p,local_1388._M_string_length);
  }
  local_1268._M_dataplus._M_p = (pointer)&local_1268.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if (paVar7 == paVar8) {
    local_1268.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1268.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_1268.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
  }
  else {
    local_1268.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1268._M_dataplus._M_p = (pointer)paVar7;
  }
  local_1268._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  local_1408._M_dataplus._M_p = (pointer)&local_1408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1408,"scantxoutset","");
  std::operator+(&local_1448,"\"start\", [\"",&EXAMPLE_DESCRIPTOR_RAW);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1448,"\"]");
  local_1428._M_dataplus._M_p = (pointer)&local_1428.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if (paVar8 == paVar7) {
    local_1428.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_1428.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_1428.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_1428._M_dataplus._M_p = (pointer)paVar8;
  }
  local_1428._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  HelpExampleRpc(&local_13e8,&local_1408,&local_1428);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1268._M_dataplus._M_p != &local_1268.field_2) {
    uVar9 = local_1268.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_13e8._M_string_length + local_1268._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13e8._M_dataplus._M_p != &local_13e8.field_2) {
      uVar9 = local_13e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_13e8._M_string_length + local_1268._M_string_length) goto LAB_002bc76d;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_13e8,0,0,local_1268._M_dataplus._M_p,local_1268._M_string_length);
  }
  else {
LAB_002bc76d:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1268,local_13e8._M_dataplus._M_p,local_13e8._M_string_length);
  }
  local_1248._M_dataplus._M_p = (pointer)&local_1248.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if (paVar7 == paVar8) {
    local_1248.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1248.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_1248.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
  }
  else {
    local_1248.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1248._M_dataplus._M_p = (pointer)paVar7;
  }
  local_1248._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  local_1488._M_dataplus._M_p = (pointer)&local_1488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1488,"scantxoutset","");
  local_14a8._M_dataplus._M_p = (pointer)&local_14a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_14a8,"\"status\"","");
  HelpExampleRpc(&local_1468,&local_1488,&local_14a8);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1248._M_dataplus._M_p != &local_1248.field_2) {
    uVar9 = local_1248.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_1468._M_string_length + local_1248._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
      uVar9 = local_1468.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_1468._M_string_length + local_1248._M_string_length) goto LAB_002bc8a5;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1468,0,0,local_1248._M_dataplus._M_p,local_1248._M_string_length);
  }
  else {
LAB_002bc8a5:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1248,local_1468._M_dataplus._M_p,local_1468._M_string_length);
  }
  local_1228._M_dataplus._M_p = (pointer)&local_1228.field_2;
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if (paVar7 == paVar8) {
    local_1228.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1228.field_2._8_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 8);
    local_1228.field_2._12_4_ = *(undefined4 *)((long)&pbVar5->field_2 + 0xc);
  }
  else {
    local_1228.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1228._M_dataplus._M_p = (pointer)paVar7;
  }
  local_1228._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  local_14e8._M_dataplus._M_p = (pointer)&local_14e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_14e8,"scantxoutset","");
  local_1508._M_dataplus._M_p = (pointer)&local_1508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1508,"\"abort\"","");
  HelpExampleRpc(&local_14c8,&local_14e8,&local_1508);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1228._M_dataplus._M_p != &local_1228.field_2) {
    uVar9 = local_1228.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_14c8._M_string_length + local_1228._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14c8._M_dataplus._M_p != &local_14c8.field_2) {
      uVar9 = local_14c8.field_2._M_allocated_capacity;
    }
    if (local_14c8._M_string_length + local_1228._M_string_length <= (ulong)uVar9) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_14c8,0,0,local_1228._M_dataplus._M_p,local_1228._M_string_length);
      goto LAB_002bc9fd;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1228,local_14c8._M_dataplus._M_p,local_14c8._M_string_length);
LAB_002bc9fd:
  local_1208 = &local_11f8;
  puVar3 = (ulong *)(pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3 == paVar8) {
    local_11f8 = paVar8->_M_allocated_capacity;
    uStack_11f0 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_11f8 = paVar8->_M_allocated_capacity;
    local_1208 = puVar3;
  }
  local_11e0 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  if (local_1208 == &local_11f8) {
    uStack_11d0 = uStack_11f0;
    local_11e8 = &local_11d8;
  }
  else {
    local_11e8 = local_1208;
  }
  local_11d8 = local_11f8;
  local_1200 = 0;
  local_11f8 = local_11f8 & 0xffffffffffffff00;
  pcVar11 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:2248:9)>
            ::_M_manager;
  name._8_16_ = in_stack_ffffffffffffe870;
  name._M_dataplus._M_p = &stack0xffffffffffffe888;
  name.field_2._8_8_ = in_RDI;
  description_15.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:2248:9)>
       ::_M_manager;
  description_15._M_dataplus._M_p = (pointer)0x0;
  description_15._M_string_length = 0;
  description_15.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:2248:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar12;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe8a8._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffe8a8._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar14;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar13;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe8d0;
  examples.m_examples._M_string_length = (size_type)pRVar16;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar15;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar17;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffe8f0;
  local_1208 = &local_11f8;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name,description_15,args,results,examples,(RPCMethodImpl *)&local_78);
  if (pcVar11 != (code *)0x0) {
    (*pcVar11)(&stack0xffffffffffffe888,&stack0xffffffffffffe888,3);
  }
  if (local_11e8 != &local_11d8) {
    operator_delete(local_11e8,local_11d8 + 1);
  }
  if (local_1208 != &local_11f8) {
    operator_delete(local_1208,local_11f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14c8._M_dataplus._M_p != &local_14c8.field_2) {
    operator_delete(local_14c8._M_dataplus._M_p,local_14c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1508._M_dataplus._M_p != &local_1508.field_2) {
    operator_delete(local_1508._M_dataplus._M_p,local_1508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14e8._M_dataplus._M_p != &local_14e8.field_2) {
    operator_delete(local_14e8._M_dataplus._M_p,local_14e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1228._M_dataplus._M_p != &local_1228.field_2) {
    operator_delete(local_1228._M_dataplus._M_p,local_1228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1468._M_dataplus._M_p != &local_1468.field_2) {
    operator_delete(local_1468._M_dataplus._M_p,local_1468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14a8._M_dataplus._M_p != &local_14a8.field_2) {
    operator_delete(local_14a8._M_dataplus._M_p,local_14a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1488._M_dataplus._M_p != &local_1488.field_2) {
    operator_delete(local_1488._M_dataplus._M_p,local_1488.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1248._M_dataplus._M_p != &local_1248.field_2) {
    operator_delete(local_1248._M_dataplus._M_p,local_1248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e8._M_dataplus._M_p != &local_13e8.field_2) {
    operator_delete(local_13e8._M_dataplus._M_p,local_13e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1428._M_dataplus._M_p != &local_1428.field_2) {
    operator_delete(local_1428._M_dataplus._M_p,local_1428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1448._M_dataplus._M_p != &local_1448.field_2) {
    operator_delete(local_1448._M_dataplus._M_p,local_1448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1408._M_dataplus._M_p != &local_1408.field_2) {
    operator_delete(local_1408._M_dataplus._M_p,local_1408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1268._M_dataplus._M_p != &local_1268.field_2) {
    operator_delete(local_1268._M_dataplus._M_p,local_1268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1388._M_dataplus._M_p != &local_1388.field_2) {
    operator_delete(local_1388._M_dataplus._M_p,local_1388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13c8._M_dataplus._M_p != &local_13c8.field_2) {
    operator_delete(local_13c8._M_dataplus._M_p,local_13c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13a8._M_dataplus._M_p != &local_13a8.field_2) {
    operator_delete(local_13a8._M_dataplus._M_p,local_13a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1288._M_dataplus._M_p != &local_1288.field_2) {
    operator_delete(local_1288._M_dataplus._M_p,local_1288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1328._M_dataplus._M_p != &local_1328.field_2) {
    operator_delete(local_1328._M_dataplus._M_p,local_1328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1368._M_dataplus._M_p != &local_1368.field_2) {
    operator_delete(local_1368._M_dataplus._M_p,local_1368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
    operator_delete(local_1348._M_dataplus._M_p,local_1348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12a8._M_dataplus._M_p != &local_12a8.field_2) {
    operator_delete(local_12a8._M_dataplus._M_p,local_12a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12e8._M_dataplus._M_p != &local_12e8.field_2) {
    operator_delete(local_12e8._M_dataplus._M_p,local_12e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1308._M_dataplus._M_p != &local_1308.field_2) {
    operator_delete(local_1308._M_dataplus._M_p,local_1308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12c8._M_dataplus._M_p != &local_12c8.field_2) {
    operator_delete(local_12c8._M_dataplus._M_p,local_12c8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1540);
  lVar10 = 0x220;
  do {
    if ((long *)((long)local_4d8 + lVar10) != *(long **)((long)local_4e8 + lVar10)) {
      operator_delete(*(long **)((long)local_4e8 + lVar10),*(long *)((long)local_4d8 + lVar10) + 1);
    }
    if ((long *)((long)local_4f8 + lVar10) != *(long **)((long)local_508 + lVar10)) {
      operator_delete(*(long **)((long)local_508 + lVar10),*(long *)((long)local_4f8 + lVar10) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar10));
    plVar4 = *(long **)((long)&local_5b0.m_cond._M_dataplus._M_p + lVar10);
    plVar6 = (long *)(local_5b0.m_cond.field_2._M_local_buf + lVar10);
    if (plVar6 != plVar4) {
      operator_delete(plVar4,*plVar6 + 1);
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1558);
  lVar10 = 0x330;
  do {
    if ((long *)(local_868 + lVar10) != *(long **)((long)local_878 + lVar10)) {
      operator_delete(*(long **)((long)local_878 + lVar10),*(long *)(local_868 + lVar10) + 1);
    }
    if ((long *)((long)local_888 + lVar10) != *(long **)((long)local_898 + lVar10)) {
      operator_delete(*(long **)((long)local_898 + lVar10),*(long *)((long)local_888 + lVar10) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_8b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar10));
    if ((long *)((long)local_8c8 + lVar10) != *(long **)((long)local_8d8 + lVar10)) {
      operator_delete(*(long **)((long)local_8d8 + lVar10),*(long *)((long)local_8c8 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11c8._M_dataplus._M_p != &local_11c8.field_2) {
    operator_delete(local_11c8._M_dataplus._M_p,local_11c8.field_2._M_allocated_capacity + 1);
  }
  if (local_11a8[0] != local_1198) {
    operator_delete(local_11a8[0],local_1198[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20.m_cond._M_dataplus._M_p != &local_a20.m_cond.field_2) {
    operator_delete(local_a20.m_cond._M_dataplus._M_p,
                    local_a20.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20.m_description._M_dataplus._M_p != &local_a20.m_description.field_2) {
    operator_delete(local_a20.m_description._M_dataplus._M_p,
                    local_a20.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a20.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a20.m_key_name._M_dataplus._M_p != &local_a20.m_key_name.field_2) {
    operator_delete(local_a20.m_key_name._M_dataplus._M_p,
                    local_a20.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1608);
  lVar10 = 0x4c8;
  do {
    if ((long *)(local_f38 + lVar10) != *(long **)((long)local_f48 + lVar10)) {
      operator_delete(*(long **)((long)local_f48 + lVar10),*(long *)(local_f38 + lVar10) + 1);
    }
    if ((long *)((long)local_f58 + lVar10) != *(long **)((long)local_f68 + lVar10)) {
      operator_delete(*(long **)((long)local_f68 + lVar10),*(long *)((long)local_f58 + lVar10) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_f88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar10));
    if ((long *)((long)local_f98 + lVar10) != *(long **)((long)local_fa8 + lVar10)) {
      operator_delete(*(long **)((long)local_fa8 + lVar10),*(long *)((long)local_f98 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8d8);
  if (local_1188[0] != local_1178) {
    operator_delete(local_1188[0],local_1178[0] + 1);
  }
  if (local_1168[0] != local_1158) {
    operator_delete(local_1168[0],local_1158[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1708);
  if (local_1148[0] != local_1138) {
    operator_delete(local_1148[0],local_1138[0] + 1);
  }
  if (local_1128[0] != local_1118) {
    operator_delete(local_1128[0],local_1118[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16e8);
  if (local_1108[0] != local_10f8) {
    operator_delete(local_1108[0],local_10f8[0] + 1);
  }
  if (local_10e8[0] != local_10d8) {
    operator_delete(local_10e8[0],local_10d8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16c8);
  if (local_10c8[0] != local_10b8) {
    operator_delete(local_10c8[0],local_10b8[0] + 1);
  }
  if (local_10a8[0] != local_1098) {
    operator_delete(local_10a8[0],local_1098[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16a8);
  if (local_1068 != &local_1058) {
    operator_delete(local_1068,local_1058 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1088._M_dataplus._M_p != &local_1088.field_2) {
    operator_delete(local_1088._M_dataplus._M_p,local_1088.field_2._M_allocated_capacity + 1);
  }
  if (local_1048[0] != local_1038) {
    operator_delete(local_1048[0],local_1038[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1688);
  if (local_1028[0] != local_1018) {
    operator_delete(local_1028[0],local_1018[0] + 1);
  }
  if (local_1008[0] != local_ff8) {
    operator_delete(local_1008[0],local_ff8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1668);
  if (local_fe8[0] != local_fd8) {
    operator_delete(local_fe8[0],local_fd8[0] + 1);
  }
  if (local_fc8[0] != local_fb8) {
    operator_delete(local_fc8[0],local_fb8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1648);
  if (local_fa8[0] != local_f98) {
    operator_delete(local_fa8[0],local_f98[0] + 1);
  }
  if (local_f88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_f88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_f88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_f88.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1628);
  if (local_f68[0] != local_f58) {
    operator_delete(local_f68[0],local_f58[0] + 1);
  }
  if (local_f48[0] != (pointer)local_f38) {
    operator_delete(local_f48[0],local_f38._0_8_ + 1);
  }
  if (local_a60[0] != local_a50) {
    operator_delete(local_a60[0],local_a50[0] + 1);
  }
  if (local_a40[0] != local_a30) {
    operator_delete(local_a40[0],local_a30[0] + 1);
  }
  if (local_998[0] != local_988) {
    operator_delete(local_998[0],local_988[0] + 1);
  }
  if (local_978[0] != local_968) {
    operator_delete(local_978[0],local_968[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15d8);
  if (local_958[0] != local_948) {
    operator_delete(local_958[0],local_948[0] + 1);
  }
  if (local_938[0] != local_928) {
    operator_delete(local_938[0],local_928[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15b8);
  if (local_918[0] != local_908) {
    operator_delete(local_918[0],local_908[0] + 1);
  }
  if (local_8f8[0] != local_8e8) {
    operator_delete(local_8f8[0],local_8e8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1598);
  if (local_8d8[0] != local_8c8) {
    operator_delete(local_8d8[0],local_8c8[0] + 1);
  }
  if (local_8b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_8b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_8b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_8b8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1578);
  if (local_898[0] != local_888) {
    operator_delete(local_898[0],local_888[0] + 1);
  }
  if (local_878[0] != (pointer)local_868) {
    operator_delete(local_878[0],local_868._0_8_ + 1);
  }
  if (local_528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_528.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  if (local_508[0] != local_4f8) {
    operator_delete(local_508[0],local_4f8[0] + 1);
  }
  if (local_4e8[0] != local_4d8) {
    operator_delete(local_4e8[0],local_4d8[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1520);
  lVar10 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_330 + lVar10 + 0x68));
    if ((long *)(local_330 + lVar10 + 0x58) != *(long **)(local_330 + lVar10 + 0x48)) {
      operator_delete(*(long **)(local_330 + lVar10 + 0x48),*(long *)(local_330 + lVar10 + 0x58) + 1
                     );
    }
    if ((long *)(local_330 + lVar10 + 0x30) != *(long **)(local_330 + lVar10 + 0x20)) {
      operator_delete(*(long **)(local_330 + lVar10 + 0x20),*(long *)(local_330 + lVar10 + 0x30) + 1
                     );
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_3b8 + lVar10 + 0x48));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(local_3b8 + lVar10 + 0x30));
    if ((long *)(local_3b8 + lVar10 + 0x18) != *(long **)(local_3b8 + lVar10 + 8)) {
      operator_delete(*(long **)(local_3b8 + lVar10 + 8),*(long *)(local_3b8 + lVar10 + 0x18) + 1);
    }
    lVar10 = lVar10 + -0x108;
  } while (lVar10 != 0);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if ((_Manager_type *)local_78._M_unused._0_8_ != local_68) {
    operator_delete(local_78._M_unused._M_object,(ulong)(local_68[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)EXAMPLE_DESCRIPTOR_RAW._M_dataplus._M_p != &EXAMPLE_DESCRIPTOR_RAW.field_2) {
    operator_delete(EXAMPLE_DESCRIPTOR_RAW._M_dataplus._M_p,
                    EXAMPLE_DESCRIPTOR_RAW.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan scantxoutset()
{
    // raw() descriptor corresponding to mainnet address 12cbQLTFMXRnSzktFkuoG3eHoMeFtpTu3S
    const std::string EXAMPLE_DESCRIPTOR_RAW = "raw(76a91411b366edfc0a8b66feebae5c2e25a7b6a5d1cf3188ac)#fm24fxxy";

    return RPCHelpMan{"scantxoutset",
        "\nScans the unspent transaction output set for entries that match certain output descriptors.\n"
        "Examples of output descriptors are:\n"
        "    addr(<address>)                      Outputs whose output script corresponds to the specified address (does not include P2PK)\n"
        "    raw(<hex script>)                    Outputs whose output script equals the specified hex-encoded bytes\n"
        "    combo(<pubkey>)                      P2PK, P2PKH, P2WPKH, and P2SH-P2WPKH outputs for the given pubkey\n"
        "    pkh(<pubkey>)                        P2PKH outputs for the given pubkey\n"
        "    sh(multi(<n>,<pubkey>,<pubkey>,...)) P2SH-multisig outputs for the given threshold and pubkeys\n"
        "    tr(<pubkey>)                         P2TR\n"
        "    tr(<pubkey>,{pk(<pubkey>)})          P2TR with single fallback pubkey in tapscript\n"
        "    rawtr(<pubkey>)                      P2TR with the specified key as output key rather than inner\n"
        "    wsh(and_v(v:pk(<pubkey>),after(2)))  P2WSH miniscript with mandatory pubkey and a timelock\n"
        "\nIn the above, <pubkey> either refers to a fixed public key in hexadecimal notation, or to an xpub/xprv optionally followed by one\n"
        "or more path elements separated by \"/\", and optionally ending in \"/*\" (unhardened), or \"/*'\" or \"/*h\" (hardened) to specify all\n"
        "unhardened or hardened child keys.\n"
        "In the latter case, a range needs to be specified by below if different from 1000.\n"
        "For more information on output descriptors, see the documentation in the doc/descriptors.md file.\n",
        {
            scan_action_arg_desc,
            scan_objects_arg_desc,
        },
        {
            RPCResult{"when action=='start'; only returns after scan completes", RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::BOOL, "success", "Whether the scan was completed"},
                {RPCResult::Type::NUM, "txouts", "The number of unspent transaction outputs scanned"},
                {RPCResult::Type::NUM, "height", "The block height at which the scan was done"},
                {RPCResult::Type::STR_HEX, "bestblock", "The hash of the block at the tip of the chain"},
                {RPCResult::Type::ARR, "unspents", "",
                {
                    {RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "txid", "The transaction id"},
                        {RPCResult::Type::NUM, "vout", "The vout value"},
                        {RPCResult::Type::STR_HEX, "scriptPubKey", "The output script"},
                        {RPCResult::Type::STR, "desc", "A specialized descriptor for the matched output script"},
                        {RPCResult::Type::STR_AMOUNT, "amount", "The total amount in " + CURRENCY_UNIT + " of the unspent output"},
                        {RPCResult::Type::BOOL, "coinbase", "Whether this is a coinbase output"},
                        {RPCResult::Type::NUM, "height", "Height of the unspent transaction output"},
                        {RPCResult::Type::STR_HEX, "blockhash", "Blockhash of the unspent transaction output"},
                        {RPCResult::Type::NUM, "confirmations", "Number of confirmations of the unspent transaction output when the scan was done"},
                    }},
                }},
                {RPCResult::Type::STR_AMOUNT, "total_amount", "The total amount of all found unspent outputs in " + CURRENCY_UNIT},
            }},
            scan_result_abort,
            scan_result_status_some,
            scan_result_status_none,
        },
        RPCExamples{
            HelpExampleCli("scantxoutset", "start \'[\"" + EXAMPLE_DESCRIPTOR_RAW + "\"]\'") +
            HelpExampleCli("scantxoutset", "status") +
            HelpExampleCli("scantxoutset", "abort") +
            HelpExampleRpc("scantxoutset", "\"start\", [\"" + EXAMPLE_DESCRIPTOR_RAW + "\"]") +
            HelpExampleRpc("scantxoutset", "\"status\"") +
            HelpExampleRpc("scantxoutset", "\"abort\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue result(UniValue::VOBJ);
    const auto action{self.Arg<std::string>("action")};
    if (action == "status") {
        CoinsViewScanReserver reserver;
        if (reserver.reserve()) {
            // no scan in progress
            return UniValue::VNULL;
        }
        result.pushKV("progress", g_scan_progress.load());
        return result;
    } else if (action == "abort") {
        CoinsViewScanReserver reserver;
        if (reserver.reserve()) {
            // reserve was possible which means no scan was running
            return false;
        }
        // set the abort flag
        g_should_abort_scan = true;
        return true;
    } else if (action == "start") {
        CoinsViewScanReserver reserver;
        if (!reserver.reserve()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Scan already in progress, use action \"abort\" or \"status\"");
        }

        if (request.params.size() < 2) {
            throw JSONRPCError(RPC_MISC_ERROR, "scanobjects argument is required for the start action");
        }

        std::set<CScript> needles;
        std::map<CScript, std::string> descriptors;
        CAmount total_in = 0;

        // loop through the scan objects
        for (const UniValue& scanobject : request.params[1].get_array().getValues()) {
            FlatSigningProvider provider;
            auto scripts = EvalDescriptorStringOrObject(scanobject, provider);
            for (CScript& script : scripts) {
                std::string inferred = InferDescriptor(script, provider)->ToString();
                needles.emplace(script);
                descriptors.emplace(std::move(script), std::move(inferred));
            }
        }

        // Scan the unspent transaction output set for inputs
        UniValue unspents(UniValue::VARR);
        std::vector<CTxOut> input_txos;
        std::map<COutPoint, Coin> coins;
        g_should_abort_scan = false;
        int64_t count = 0;
        std::unique_ptr<CCoinsViewCursor> pcursor;
        const CBlockIndex* tip;
        NodeContext& node = EnsureAnyNodeContext(request.context);
        {
            ChainstateManager& chainman = EnsureChainman(node);
            LOCK(cs_main);
            Chainstate& active_chainstate = chainman.ActiveChainstate();
            active_chainstate.ForceFlushStateToDisk();
            pcursor = CHECK_NONFATAL(active_chainstate.CoinsDB().Cursor());
            tip = CHECK_NONFATAL(active_chainstate.m_chain.Tip());
        }
        bool res = FindScriptPubKey(g_scan_progress, g_should_abort_scan, count, pcursor.get(), needles, coins, node.rpc_interruption_point);
        result.pushKV("success", res);
        result.pushKV("txouts", count);
        result.pushKV("height", tip->nHeight);
        result.pushKV("bestblock", tip->GetBlockHash().GetHex());

        for (const auto& it : coins) {
            const COutPoint& outpoint = it.first;
            const Coin& coin = it.second;
            const CTxOut& txo = coin.out;
            const CBlockIndex& coinb_block{*CHECK_NONFATAL(tip->GetAncestor(coin.nHeight))};
            input_txos.push_back(txo);
            total_in += txo.nValue;

            UniValue unspent(UniValue::VOBJ);
            unspent.pushKV("txid", outpoint.hash.GetHex());
            unspent.pushKV("vout", outpoint.n);
            unspent.pushKV("scriptPubKey", HexStr(txo.scriptPubKey));
            unspent.pushKV("desc", descriptors[txo.scriptPubKey]);
            unspent.pushKV("amount", ValueFromAmount(txo.nValue));
            unspent.pushKV("coinbase", coin.IsCoinBase());
            unspent.pushKV("height", coin.nHeight);
            unspent.pushKV("blockhash", coinb_block.GetBlockHash().GetHex());
            unspent.pushKV("confirmations", tip->nHeight - coin.nHeight + 1);

            unspents.push_back(std::move(unspent));
        }
        result.pushKV("unspents", std::move(unspents));
        result.pushKV("total_amount", ValueFromAmount(total_in));
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid action '%s'", action));
    }
    return result;
},
    };
}